

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util-test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_33f1::UtilTest_ExecuteShellCommand_Test::TestBody
          (UtilTest_ExecuteShellCommand_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_;
  Error *e;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  AssertionResult *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  Type in_stack_ffffffffffffff9c;
  AssertHelper *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffaf;
  CStringRef in_stack_ffffffffffffffb0;
  BasicCStringRef<char> local_38;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  AssertionResult *in_stack_ffffffffffffffe8;
  BasicCStringRef<char> in_stack_fffffffffffffff0;
  
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xfffffffffffffff0,"cd .");
  ExecuteShellCommand(in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_38,"dir/bad-command");
  ExecuteShellCommand(in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
  std::__cxx11::string::find(&stack0xffffffffffffffd0,0x179491);
  testing::AssertionResult::AssertionResult
            (in_stack_ffffffffffffff70,SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffa0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
    testing::Message::operator<<((Message *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffff0.data_,(Message *)in_stack_ffffffffffffffe8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    testing::Message::~Message((Message *)0x10e835);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e89f);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

TEST(UtilTest, ExecuteShellCommand) {
  ExecuteShellCommand("cd .");
  std::string message;
  try {
    ExecuteShellCommand("dir/bad-command");
  } catch (const mp::Error &e) {
    message = e.what();
  }
  EXPECT_TRUE(message.find("process exited with code ") != std::string::npos)
    << message;
}